

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGforStageCreation.cpp
# Opt level: O0

void __thiscall
BGforStageCreation::Fill_FirstOHtsI
          (BGforStageCreation *this,PlanningUnitMADPDiscrete *pu,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  Index IVar1;
  PlanningUnitMADPDiscrete *this_00;
  PlanningUnitMADPDiscrete *pPVar2;
  LIndex i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  long *in_RSI;
  Index fI;
  Index agI;
  Index in_stack_ffffffffffffffc8;
  Index in_stack_ffffffffffffffcc;
  uint uVar3;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8ba201);
  uVar3 = 0;
  while( true ) {
    this_00 = (PlanningUnitMADPDiscrete *)(ulong)uVar3;
    pPVar2 = (PlanningUnitMADPDiscrete *)(**(code **)(*in_RSI + 0x30))();
    if (pPVar2 <= this_00) break;
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  (this_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    IVar1 = Globals::CastLIndexToIndex(i);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_RCX,(value_type_conflict1 *)CONCAT44(uVar3,IVar1));
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void  BGforStageCreation::Fill_FirstOHtsI(
        const PlanningUnitMADPDiscrete* pu,
        Index ts, 
        vector<Index>& firstOHtsI
        )
{
    firstOHtsI.clear();
    //because the OHs are constructed breath-first, we know the OHs for agent i
    //for this time step are numbered:
    //firstOHtsGI[i]...firstOHtsGI[i]+nrOH[i]-1
    //
    //(read first-OH-for-time-step-ts its Global Index)
    //
    //i.e. ohGI = ohI + firstOHtsGI 

    for(Index agI=0; agI < pu->GetNrAgents(); agI++)
    {
        Index fI = CastLIndexToIndex(pu->GetFirstObservationHistoryIndex(agI, ts));
        firstOHtsI.push_back(fI); 
    }
}